

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcMem.c
# Opt level: O0

Vec_Int_t * Wlc_NtkFindConflict(Wlc_Ntk_t *p,Vec_Int_t *vMemObjs,Vec_Wrd_t *vValues,int nFrames)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int i_00;
  int iVar6;
  Vec_Wec_t *p_00;
  Wlc_Obj_t *pObj_00;
  Vec_Int_t *pVVar7;
  Vec_Int_t *pVVar8;
  word wVar9;
  word wVar10;
  Vec_Int_t *p_01;
  int iInd2;
  int iNum2;
  int iFrm2;
  int iObj2;
  int iInd1;
  int iNum1;
  int iFrm1;
  int iObj1;
  Vec_Int_t *vTrace2;
  Vec_Int_t *vTrace1;
  Vec_Int_t *vTrace;
  Vec_Wec_t *vTraces;
  int local_40;
  int Entry;
  int f;
  int i;
  Wlc_Obj_t *pObj;
  int nFrames_local;
  Vec_Wrd_t *vValues_local;
  Vec_Int_t *vMemObjs_local;
  Wlc_Ntk_t *p_local;
  
  p_00 = Vec_WecAlloc(100);
  iVar1 = Vec_IntSize(vMemObjs);
  iVar2 = Vec_WrdSize(vValues);
  if (nFrames * 3 * iVar1 != iVar2) {
    __assert_fail("3 * nFrames * Vec_IntSize(vMemObjs) == Vec_WrdSize(vValues)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wlc/wlcMem.c"
                  ,0x357,
                  "Vec_Int_t *Wlc_NtkFindConflict(Wlc_Ntk_t *, Vec_Int_t *, Vec_Wrd_t *, int)");
  }
  Wlc_NtkCleanCopy(p);
  for (Entry = 0; iVar1 = Vec_IntSize(vMemObjs), Entry < iVar1; Entry = Entry + 1) {
    iVar1 = Vec_IntEntry(vMemObjs,Entry);
    Wlc_ObjSetCopy(p,iVar1,Entry);
  }
  for (local_40 = 0; local_40 < nFrames; local_40 = local_40 + 1) {
    for (Entry = 0; iVar1 = Vec_IntSize(vMemObjs), Entry < iVar1; Entry = Entry + 1) {
      iVar1 = Vec_IntEntry(vMemObjs,Entry);
      pObj_00 = Wlc_NtkObj(p,iVar1);
      iVar1 = Wlc_ObjType(pObj_00);
      if (iVar1 == 0x36) {
        pVVar7 = Wlc_NtkTrace(p,pObj_00,local_40,vMemObjs,vValues);
        iVar1 = Wlc_NtkTraceCheckConfict(p,pVVar7,vMemObjs,vValues);
        if (iVar1 != 0) {
          Vec_WecFree(p_00);
          return pVVar7;
        }
        Vec_WecPushLevel(p_00);
        pVVar8 = Vec_WecEntryLast(p_00);
        Vec_IntAppend(pVVar8,pVVar7);
        Vec_IntFree(pVVar7);
      }
    }
  }
  Entry = 0;
  do {
    iVar1 = Vec_WecSize(p_00);
    if (iVar1 <= Entry) {
      Vec_WecFree(p_00);
      return (Vec_Int_t *)0x0;
    }
    pVVar7 = Vec_WecEntry(p_00,Entry);
    for (local_40 = 0; local_40 < Entry; local_40 = local_40 + 1) {
      pVVar8 = Vec_WecEntry(p_00,local_40);
      iVar1 = Vec_IntEntry(pVVar7,0);
      iVar2 = Vec_IntEntry(pVVar8,0);
      if (iVar1 == iVar2) {
        iVar1 = Vec_IntEntryLast(pVVar7);
        iVar2 = Vec_IntEntryLast(pVVar7);
        iVar3 = Wlc_ObjCopy(p,iVar1 >> 0xb);
        iVar4 = Vec_IntSize(vMemObjs);
        iVar2 = ((iVar2 >> 1 & 0x3ffU) * iVar4 + iVar3) * 3;
        iVar4 = Vec_IntEntryLast(pVVar8);
        iVar5 = Vec_IntEntryLast(pVVar8);
        i_00 = Wlc_ObjCopy(p,iVar4 >> 0xb);
        iVar6 = Vec_IntSize(vMemObjs);
        iVar5 = ((iVar5 >> 1 & 0x3ffU) * iVar6 + i_00) * 3;
        iVar3 = Vec_IntEntry(vMemObjs,iVar3);
        if (iVar1 >> 0xb != iVar3) {
          __assert_fail("iObj1 == Vec_IntEntry(vMemObjs, iNum1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wlc/wlcMem.c"
                        ,0x37b,
                        "Vec_Int_t *Wlc_NtkFindConflict(Wlc_Ntk_t *, Vec_Int_t *, Vec_Wrd_t *, int)"
                       );
        }
        iVar1 = Vec_IntEntry(vMemObjs,i_00);
        if (iVar4 >> 0xb != iVar1) {
          __assert_fail("iObj2 == Vec_IntEntry(vMemObjs, iNum2)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wlc/wlcMem.c"
                        ,0x37c,
                        "Vec_Int_t *Wlc_NtkFindConflict(Wlc_Ntk_t *, Vec_Int_t *, Vec_Wrd_t *, int)"
                       );
        }
        wVar9 = Vec_WrdEntry(vValues,iVar2 + 1);
        wVar10 = Vec_WrdEntry(vValues,iVar5 + 1);
        if (wVar9 == wVar10) {
          wVar9 = Vec_WrdEntry(vValues,iVar2 + 2);
          wVar10 = Vec_WrdEntry(vValues,iVar5 + 2);
          if (wVar9 != wVar10) {
            p_01 = Vec_IntAlloc(100);
            iVar1 = Vec_IntPop(pVVar7);
            Vec_IntPush(p_01,iVar1);
            for (Entry = 1; iVar1 = Vec_IntSize(pVVar7), Entry < iVar1; Entry = Entry + 1) {
              iVar1 = Vec_IntEntry(pVVar7,Entry);
              Vec_IntPushUnique(p_01,iVar1);
            }
            for (Entry = 1; iVar1 = Vec_IntSize(pVVar8), Entry < iVar1; Entry = Entry + 1) {
              iVar1 = Vec_IntEntry(pVVar8,Entry);
              Vec_IntPushUnique(p_01,iVar1);
            }
            Vec_WecFree(p_00);
            return p_01;
          }
        }
      }
    }
    Entry = Entry + 1;
  } while( true );
}

Assistant:

Vec_Int_t * Wlc_NtkFindConflict( Wlc_Ntk_t * p, Vec_Int_t * vMemObjs, Vec_Wrd_t * vValues, int nFrames )
{
    Wlc_Obj_t * pObj; int i, f, Entry;
    Vec_Wec_t * vTraces = Vec_WecAlloc( 100 );
    Vec_Int_t * vTrace, * vTrace1, * vTrace2;
    assert( 3 * nFrames * Vec_IntSize(vMemObjs) == Vec_WrdSize(vValues) );
    Wlc_NtkCleanCopy( p );
    Vec_IntForEachEntry( vMemObjs, Entry, i )
        Wlc_ObjSetCopy( p, Entry, i );
    for ( f = 0; f < nFrames; f++ )
    {
        Wlc_NtkForEachObjVec( vMemObjs, p, pObj, i )
        {
            if ( Wlc_ObjType(pObj) != WLC_OBJ_READ )
                continue;
            vTrace = Wlc_NtkTrace( p, pObj, f, vMemObjs, vValues );
            if ( Wlc_NtkTraceCheckConfict( p, vTrace, vMemObjs, vValues ) )
            {
                Vec_WecFree( vTraces );
                return vTrace;
            }
            Vec_WecPushLevel( vTraces );
            Vec_IntAppend( Vec_WecEntryLast(vTraces), vTrace );
            Vec_IntFree( vTrace );
        }
    }
    // check if there are any common read addresses
    Vec_WecForEachLevel( vTraces, vTrace1, i )
    Vec_WecForEachLevelStop( vTraces, vTrace2, f, i )
        if ( Vec_IntEntry(vTrace1, 0) == Vec_IntEntry(vTrace2, 0) )
        {
            int iObj1 = Vec_IntEntryLast(vTrace1) >> 11;
            int iFrm1 =(Vec_IntEntryLast(vTrace1) >> 1) & 0x3FF;
            int iNum1 = Wlc_ObjCopy( p, iObj1 );
            int iInd1 = 3*(iFrm1*Vec_IntSize(vMemObjs) + iNum1);

            int iObj2 = Vec_IntEntryLast(vTrace2) >> 11;
            int iFrm2 =(Vec_IntEntryLast(vTrace2) >> 1) & 0x3FF;
            int iNum2 = Wlc_ObjCopy( p, iObj2 );
            int iInd2 = 3*(iFrm2*Vec_IntSize(vMemObjs) + iNum2);

            assert( iObj1 == Vec_IntEntry(vMemObjs, iNum1) );
            assert( iObj2 == Vec_IntEntry(vMemObjs, iNum2) );
            if ( Vec_WrdEntry(vValues, iInd1 + 1) == Vec_WrdEntry(vValues, iInd2 + 1) &&  // equal address
                 Vec_WrdEntry(vValues, iInd1 + 2) != Vec_WrdEntry(vValues, iInd2 + 2) )   // diff data
            {
                vTrace = Vec_IntAlloc( 100 );
                Vec_IntPush( vTrace, Vec_IntPop(vTrace1) );
                Vec_IntForEachEntryStart( vTrace1, Entry, i, 1 )
                    Vec_IntPushUnique( vTrace, Entry );
                Vec_IntForEachEntryStart( vTrace2, Entry, i, 1 )
                    Vec_IntPushUnique( vTrace, Entry );
                Vec_WecFree( vTraces );
                return vTrace;
            }
        }
    Vec_WecFree( vTraces );
    return NULL;
}